

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O0

void __thiscall DThinker::DThinker(DThinker *this,int statnum)

{
  int local_14;
  int statnum_local;
  DThinker *this_local;
  
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_009f49c8;
  this->NextThinker = (DThinker *)0x0;
  this->PrevThinker = (DThinker *)0x0;
  if ((bSerialOverride & 1U) == 0) {
    (this->super_DObject).ObjectFlags = (this->super_DObject).ObjectFlags | 0x100;
    local_14 = statnum;
    if (0x7f < (uint)statnum) {
      local_14 = 0x7f;
    }
    FThinkerList::AddTail(FreshThinkers + local_14,this);
  }
  return;
}

Assistant:

DThinker::DThinker (int statnum) throw()
{
	NextThinker = NULL;
	PrevThinker = NULL;
	if (bSerialOverride)
	{ // The serializer will insert us into the right list
		return;
	}

	ObjectFlags |= OF_JustSpawned;
	if ((unsigned)statnum > MAX_STATNUM)
	{
		statnum = MAX_STATNUM;
	}
	FreshThinkers[statnum].AddTail (this);
}